

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::InstanceSymbol::connectDefaultIfacePorts(InstanceSymbol *this)

{
  SourceRange range;
  LookupLocation lookupLocation;
  SourceLocation loc_00;
  string_view name;
  DeferredSourceRange sourceRange;
  bool bVar1;
  uint uVar2;
  reference ppSVar3;
  allocator<std::pair<const_unsigned_long,_unsigned_long>_> *paVar4;
  unsigned_long *args_2;
  raw_key_type *__y;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::PortConnection_*const,_18446744073709551615UL> *this_00;
  Symbol *in_RDI;
  SourceRange portRange;
  InstanceSymbol *firstInst;
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> dims;
  ModportSymbol *modport;
  Symbol *inst;
  InterfacePortSymbol *ifacePort;
  Symbol *port;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range2;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> conns;
  ASTContext context;
  Compilation *comp;
  Scope *parent;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  unsigned_long *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SourceLocation in_stack_fffffffffffffb78;
  SourceLocation in_stack_fffffffffffffb80;
  ASTContext *in_stack_fffffffffffffb88;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffb90;
  Compilation *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  InterfacePortSymbol *in_stack_fffffffffffffba8;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbc0;
  InstanceSymbol *in_stack_fffffffffffffbf8;
  InstanceSymbol *pIVar5;
  ASTContext *in_stack_fffffffffffffc00;
  InterfacePortSymbol *in_stack_fffffffffffffc08;
  Compilation *this_01;
  SourceLocation in_stack_fffffffffffffc20;
  SourceLocation in_stack_fffffffffffffc28;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> PVar6;
  Symbol *local_358;
  undefined8 local_350;
  InstanceSymbol **in_stack_fffffffffffffcb8;
  InterfacePortSymbol *in_stack_fffffffffffffcc0;
  Compilation *in_stack_fffffffffffffcc8;
  iterator in_stack_fffffffffffffcd0;
  iterator in_stack_fffffffffffffcd8;
  pair<slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> local_318;
  InterfacePortSymbol *local_308;
  SourceLocation local_300;
  size_t local_2f8;
  char *pcStack_2f0;
  SourceLocation local_2e8;
  SourceLocation SStack_2e0;
  SourceLocation local_2d0;
  SourceLocation SStack_2c8;
  ASTContext *local_2c0;
  SourceLocation local_2b8;
  SourceLocation local_2b0;
  SourceRange local_2a8;
  ConstantRange *local_298;
  ConstantRange *local_290;
  long local_288;
  SourceLocation local_268;
  SourceLocation local_260;
  InterfacePortSymbol *local_258;
  Symbol *local_250;
  Symbol **local_248;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_240 [3];
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> local_228;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_218;
  SmallVectorBase<const_slang::ast::PortConnection_*> local_210 [2];
  bitmask<slang::ast::ASTFlags> local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Compilation *local_180;
  Scope *local_178;
  SourceLocation local_168;
  unsigned_long *local_160;
  InstanceSymbol *local_158;
  undefined1 local_149;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
  local_148;
  SourceLocation local_140;
  unsigned_long *local_138;
  InstanceSymbol *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
  local_b0;
  size_t local_98;
  unsigned_long *local_90;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_88;
  SourceLocation local_80;
  unsigned_long *local_78;
  undefined1 *local_70;
  InstanceSymbol *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  unsigned_long *local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_10;
  InstanceSymbol *local_8;
  
  local_178 = Symbol::getParentScope(in_RDI);
  local_180 = Scope::getCompilation(local_178);
  local_1c8 = LookupLocation::max;
  uStack_1c0 = DAT_01a3c808;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_1d0,None);
  lookupLocation._8_7_ = in_stack_fffffffffffffba0;
  lookupLocation.scope = (Scope *)in_stack_fffffffffffffb98;
  lookupLocation._15_1_ = in_stack_fffffffffffffba7;
  ASTContext::ASTContext
            (in_stack_fffffffffffffb88,(Scope *)in_stack_fffffffffffffb80,lookupLocation,
             in_stack_fffffffffffffb90);
  SmallVector<const_slang::ast::PortConnection_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::PortConnection_*,_5UL> *)0xfc3c8f);
  local_228 = InstanceBodySymbol::getPortList((InstanceBodySymbol *)in_stack_fffffffffffffb78);
  local_218 = &local_228;
  local_240[0]._M_current =
       (Symbol **)
       std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffb78);
  local_248 = (Symbol **)
              std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
                        ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                         in_stack_fffffffffffffb88);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffb80,
                       (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffb78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      SmallVectorBase<const_slang::ast::PortConnection_*>::copy
                (local_210,(EVP_PKEY_CTX *)local_180,src);
      std::span<const_slang::ast::PortConnection_*const,_18446744073709551615UL>::
      span<const_slang::ast::PortConnection_*,_18446744073709551615UL>
                (this_00,(span<const_slang::ast::PortConnection_*,_18446744073709551615UL> *)
                         in_stack_fffffffffffffb88);
      in_RDI[1].nextInScope = local_358;
      *(undefined8 *)&in_RDI[1].indexInScope = local_350;
      SmallVector<const_slang::ast::PortConnection_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::PortConnection_*,_5UL> *)0xfc46e2);
      return;
    }
    ppSVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
              ::operator*(local_240);
    local_250 = *ppSVar3;
    if (local_250->kind == InterfacePort) {
      local_258 = Symbol::as<slang::ast::InterfacePortSymbol>((Symbol *)0xfc3d62);
      if (local_258->interfaceDef != (DefinitionSymbol *)0x0) {
        local_268 = (SourceLocation)0x0;
        InterfacePortSymbol::getDeclaredRange
                  ((InterfacePortSymbol *)in_stack_fffffffffffffcd0._M_current);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                            *)0xfc3dbf);
        if (bVar1) {
          local_288 = 0;
          std::optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>::operator->
                    ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                     0xfc3e09);
          local_290 = (ConstantRange *)
                      std::span<const_slang::ConstantRange,_18446744073709551615UL>::begin
                                ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                                 in_stack_fffffffffffffb78);
          std::optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>::operator->
                    ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
                     0xfc3e26);
          local_298 = (ConstantRange *)
                      std::span<const_slang::ConstantRange,_18446744073709551615UL>::end
                                ((span<const_slang::ConstantRange,_18446744073709551615UL> *)
                                 in_stack_fffffffffffffb88);
          local_260 = (SourceLocation)
                      recurseDefaultIfaceInst
                                (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                 in_stack_fffffffffffffcb8,in_stack_fffffffffffffcd8,
                                 in_stack_fffffffffffffcd0);
          if (local_288 != 0) {
            local_2b0 = local_250->location;
            std::basic_string_view<char,_std::char_traits<char>_>::length(&local_250->name);
            local_2b8 = SourceLocation::operator+<unsigned_long>
                                  ((SourceLocation *)in_stack_fffffffffffffb88,
                                   (unsigned_long)in_stack_fffffffffffffb80);
            SourceRange::SourceRange(&local_2a8,local_2b0,local_2b8);
            local_2e8 = local_2a8.startLoc;
            SStack_2e0 = local_2a8.endLoc;
            range.endLoc = in_stack_fffffffffffffb80;
            range.startLoc = in_stack_fffffffffffffb78;
            PVar6.value = (uintptr_t)local_258;
            slang::syntax::DeferredSourceRange::DeferredSourceRange
                      ((DeferredSourceRange *)0xfc3f56,range);
            sourceRange.range.endLoc = in_stack_fffffffffffffc28;
            sourceRange.range.startLoc = in_stack_fffffffffffffc20;
            sourceRange.node.value = PVar6.value;
            in_stack_fffffffffffffb78 = local_2d0;
            in_stack_fffffffffffffb80 = SStack_2c8;
            in_stack_fffffffffffffb88 = local_2c0;
            in_stack_fffffffffffffc28 =
                 (SourceLocation)
                 InterfacePortSymbol::getModport
                           (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                            in_stack_fffffffffffffbf8,sourceRange);
            local_268 = in_stack_fffffffffffffc28;
          }
        }
        else {
          local_2f8 = (local_250->name)._M_len;
          pcStack_2f0 = (local_250->name)._M_str;
          local_300 = local_250->location;
          name._M_str = (char *)in_stack_fffffffffffffbb0;
          name._M_len = (size_t)in_stack_fffffffffffffba8;
          loc_00._7_1_ = in_stack_fffffffffffffba7;
          loc_00._0_7_ = in_stack_fffffffffffffba0;
          in_stack_fffffffffffffc20 =
               (SourceLocation)
               InstanceArraySymbol::createEmpty(in_stack_fffffffffffffb98,name,loc_00);
          local_260 = in_stack_fffffffffffffc20;
        }
        Symbol::setParent((Symbol *)local_260,local_178);
        this_01 = local_180;
        std::pair<slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*>::
        pair<slang::ast::Symbol_*&,_const_slang::ast::ModportSymbol_*&,_true>
                  (&local_318,(Symbol **)&local_260,(ModportSymbol **)&local_268);
        in_stack_fffffffffffffc08 =
             (InterfacePortSymbol *)
             BumpAllocator::
             emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&,std::pair<slang::ast::Symbol*,slang::ast::ModportSymbol_const*>,decltype(nullptr)>
                       ((BumpAllocator *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                        (pair<slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
                        CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                        (void **)in_stack_fffffffffffffb98);
        local_308 = in_stack_fffffffffffffc08;
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection*>
                  ((SmallVectorBase<const_slang::ast::PortConnection_*> *)in_stack_fffffffffffffb88,
                   (PortConnection **)in_stack_fffffffffffffb80);
        pIVar5 = (InstanceSymbol *)in_RDI[1].parentScope;
        in_stack_fffffffffffffcd8._M_current = (ConstantRange *)local_250;
        in_stack_fffffffffffffc00 =
             (ASTContext *)SmallVectorBase<const_slang::ast::PortConnection_*>::back(local_210);
        in_stack_fffffffffffffcd0._M_current =
             (ConstantRange *)(in_stack_fffffffffffffc00->scope).ptr;
        local_160 = (unsigned_long *)&stack0xfffffffffffffcd8;
        local_168 = (SourceLocation)&stack0xfffffffffffffcd0;
        in_stack_fffffffffffffbf8 = pIVar5;
        local_158 = pIVar5;
        local_140 = local_168;
        local_138 = local_160;
        local_130 = pIVar5;
        paVar4 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::al((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                       *)0xfc41b2);
        boost::unordered::detail::foa::
        alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
        ::alloc_cted_or_fwded_key_type(&local_148,paVar4,local_138);
        local_78 = boost::unordered::detail::foa::
                   alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_unsigned_long_&&,_void>
                   ::move_or_fwd(&local_148);
        local_70 = &local_149;
        local_80 = local_140;
        local_68 = pIVar5;
        local_88 = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    *)boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      ::key_from<unsigned_long,unsigned_long>(local_78,local_140);
        args_2 = (unsigned_long *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::hash_for<unsigned_long>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             *)in_stack_fffffffffffffb80,(unsigned_long *)in_stack_fffffffffffffb78)
        ;
        local_90 = args_2;
        local_98 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                   *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
        local_10 = local_88;
        local_20 = local_90;
        local_18 = local_98;
        local_8 = pIVar5;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_98);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     ::groups((table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                               *)0xfc4305);
          local_40 = local_40 + local_38;
          uVar2 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
          local_44 = uVar2;
          if (uVar2 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                       ::elements((table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                   *)0xfc435a);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffba8 =
                   (InterfacePortSymbol *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)0xfc43aa);
              in_stack_fffffffffffffbb0 = local_10;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                    ::key_from<std::pair<unsigned_long_const,unsigned_long>>
                              ((pair<const_unsigned_long,_unsigned_long> *)0xfc43d7);
              bVar1 = std::equal_to<unsigned_long>::operator()
                                ((equal_to<unsigned_long> *)in_stack_fffffffffffffba8,
                                 (unsigned_long *)in_stack_fffffffffffffbb0,__y);
              if (bVar1) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
                ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                goto LAB_00fc44de;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          in_stack_fffffffffffffba7 =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
          if ((bool)in_stack_fffffffffffffba7) {
            memset(&local_b0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
            ::table_locator(&local_b0);
            goto LAB_00fc44de;
          }
          bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,
                             (size_t)(pIVar5->super_InstanceSymbolBase).super_Symbol.name._M_len);
        } while (bVar1);
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
        ::table_locator(&local_b0);
LAB_00fc44de:
        bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_b0);
        if (bVar1) {
          local_c0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     ::make_iterator((locator *)0xfc44fe);
          local_c1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)&stack0xfffffffffffffcb8,&local_c0,&local_c1);
        }
        else if ((pIVar5->super_InstanceSymbolBase).super_Symbol.nextInScope <
                 (Symbol *)(pIVar5->super_InstanceSymbolBase).super_Symbol.parentScope) {
          in_stack_fffffffffffffb78 = local_80;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    (in_stack_fffffffffffffbb0,(size_t)in_stack_fffffffffffffba8,
                     CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                     (try_emplace_args_t *)in_stack_fffffffffffffb98,
                     (unsigned_long *)in_stack_fffffffffffffb90.m_bits,
                     (unsigned_long *)CONCAT44(uVar2,in_stack_fffffffffffffbc0));
          local_d8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     ::make_iterator((locator *)0xfc459a);
          local_f1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)&stack0xfffffffffffffcb8,&local_d8,local_f1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)this_01,(size_t)in_stack_fffffffffffffc08,
                     (try_emplace_args_t *)in_stack_fffffffffffffc00,
                     (unsigned_long *)in_stack_fffffffffffffbf8,args_2);
          local_108 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::make_iterator((locator *)0xfc4612);
          local_121[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)&stack0xfffffffffffffcb8,&local_108,local_121);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
    ::operator++(local_240);
  } while( true );
}

Assistant:

void InstanceSymbol::connectDefaultIfacePorts() const {
    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    auto& comp = parent->getCompilation();
    ASTContext context(*parent, LookupLocation::max);

    SmallVector<const PortConnection*> conns;
    for (auto port : body.getPortList()) {
        if (port->kind == SymbolKind::InterfacePort) {
            auto& ifacePort = port->as<InterfacePortSymbol>();
            if (ifacePort.interfaceDef) {
                Symbol* inst;
                const ModportSymbol* modport = nullptr;
                if (auto dims = ifacePort.getDeclaredRange()) {
                    const InstanceSymbol* firstInst = nullptr;
                    inst = recurseDefaultIfaceInst(comp, ifacePort, firstInst, dims->begin(),
                                                   dims->end());

                    if (firstInst) {
                        auto portRange = SourceRange{port->location,
                                                     port->location + port->name.length()};
                        modport = ifacePort.getModport(context, *firstInst, portRange);
                    }
                }
                else {
                    inst = &InstanceArraySymbol::createEmpty(comp, port->name, port->location);
                }

                inst->setParent(*parent);
                conns.emplace_back(
                    comp.emplace<PortConnection>(ifacePort, std::pair{inst, modport}, nullptr));
                connectionMap->emplace(reinterpret_cast<uintptr_t>(port),
                                       reinterpret_cast<uintptr_t>(conns.back()));
            }
        }
    }
    connections = conns.copy(comp);
}